

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector2 Vector2Normalize(Vector2 v)

{
  Vector2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = v.x;
  fVar2 = v.y;
  fVar4 = SQRT(fVar3 * fVar3 + fVar2 * fVar2);
  if (0.0 < fVar4) {
    fVar4 = 1.0 / fVar4;
    fVar3 = fVar4 * fVar3;
    fVar4 = fVar4 * fVar2;
  }
  else {
    fVar3 = 0.0;
    fVar4 = 0.0;
  }
  VVar1.y = fVar4;
  VVar1.x = fVar3;
  return VVar1;
}

Assistant:

RMAPI Vector2 Vector2Normalize(Vector2 v)
{
    Vector2 result = { 0 };
    float length = sqrtf((v.x*v.x) + (v.y*v.y));

    if (length > 0)
    {
        float ilength = 1.0f/length;
        result.x = v.x*ilength;
        result.y = v.y*ilength;
    }

    return result;
}